

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O2

uint __thiscall llvm::StringMapImpl::RehashTable(StringMapImpl *this,uint BucketNo)

{
  uint uVar1;
  uint uVar2;
  StringMapEntryBase **ppSVar3;
  StringMapEntryBase *pSVar4;
  StringMapEntryBase **ppSVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  ppSVar3 = this->TheTable;
  uVar12 = this->NumBuckets;
  uVar13 = (ulong)uVar12;
  if (uVar12 * 3 < this->NumItems * 4) {
    uVar12 = uVar12 * 2;
    uVar8 = (ulong)uVar12;
  }
  else {
    uVar8 = uVar13;
    if (uVar12 >> 3 < uVar12 - (this->NumItems + this->NumTombstones)) {
      return BucketNo;
    }
  }
  ppSVar5 = (StringMapEntryBase **)safe_calloc((ulong)(uVar12 + 1),0xc);
  ppSVar5[uVar8] = (StringMapEntryBase *)0x2;
  uVar1 = this->NumBuckets;
  uVar9 = 0;
  uVar6 = (ulong)BucketNo;
  while( true ) {
    if (uVar9 == uVar1) break;
    pSVar4 = this->TheTable[uVar9];
    if ((pSVar4 != (StringMapEntryBase *)0xfffffffffffffff8) &&
       (pSVar4 != (StringMapEntryBase *)0x0)) {
      uVar2 = *(uint *)((long)ppSVar3 + uVar9 * 4 + uVar13 * 8 + 8);
      uVar11 = (ulong)(uVar2 & uVar12 - 1);
      if (ppSVar5[uVar11] != (StringMapEntryBase *)0x0) {
        iVar7 = 1;
        do {
          uVar10 = (int)uVar11 + iVar7;
          iVar7 = iVar7 + 1;
          uVar11 = (ulong)(uVar10 & uVar12 - 1);
        } while (ppSVar5[uVar11] != (StringMapEntryBase *)0x0);
      }
      ppSVar5[uVar11] = pSVar4;
      *(uint *)((long)(ppSVar5 + uVar8) + uVar11 * 4 + 8) = uVar2;
      if (uVar9 == BucketNo) {
        uVar6 = uVar11;
      }
    }
    uVar9 = uVar9 + 1;
  }
  free(this->TheTable);
  this->TheTable = ppSVar5;
  this->NumBuckets = uVar12;
  this->NumTombstones = 0;
  return (uint)uVar6;
}

Assistant:

unsigned StringMapImpl::RehashTable(unsigned BucketNo) {
  unsigned NewSize;
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  // If the hash table is now more than 3/4 full, or if fewer than 1/8 of
  // the buckets are empty (meaning that many are filled with tombstones),
  // grow/rehash the table.
  if (LLVM_UNLIKELY(NumItems * 4 > NumBuckets * 3)) {
    NewSize = NumBuckets*2;
  } else if (LLVM_UNLIKELY(NumBuckets - (NumItems + NumTombstones) <=
                           NumBuckets / 8)) {
    NewSize = NumBuckets;
  } else {
    return BucketNo;
  }

  unsigned NewBucketNo = BucketNo;
  // Allocate one extra bucket which will always be non-empty.  This allows the
  // iterators to stop at end.
  auto NewTableArray = static_cast<StringMapEntryBase **>(
      safe_calloc(NewSize+1, sizeof(StringMapEntryBase *) + sizeof(unsigned)));

  unsigned *NewHashArray = (unsigned *)(NewTableArray + NewSize + 1);
  NewTableArray[NewSize] = (StringMapEntryBase*)2;

  // Rehash all the items into their new buckets.  Luckily :) we already have
  // the hash values available, so we don't have to rehash any strings.
  for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
    StringMapEntryBase *Bucket = TheTable[I];
    if (Bucket && Bucket != getTombstoneVal()) {
      // Fast case, bucket available.
      unsigned FullHash = HashTable[I];
      unsigned NewBucket = FullHash & (NewSize-1);
      if (!NewTableArray[NewBucket]) {
        NewTableArray[FullHash & (NewSize-1)] = Bucket;
        NewHashArray[FullHash & (NewSize-1)] = FullHash;
        if (I == BucketNo)
          NewBucketNo = NewBucket;
        continue;
      }

      // Otherwise probe for a spot.
      unsigned ProbeSize = 1;
      do {
        NewBucket = (NewBucket + ProbeSize++) & (NewSize-1);
      } while (NewTableArray[NewBucket]);

      // Finally found a slot.  Fill it in.
      NewTableArray[NewBucket] = Bucket;
      NewHashArray[NewBucket] = FullHash;
      if (I == BucketNo)
        NewBucketNo = NewBucket;
    }
  }

  free(TheTable);

  TheTable = NewTableArray;
  NumBuckets = NewSize;
  NumTombstones = 0;
  return NewBucketNo;
}